

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O0

wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
 __thiscall
boost::ext::di::v1_3_0::core::
injector<$_8::TEMPNAMEPLACEHOLDERVALUE()const::must_be_creatable_or_bound,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<true,boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,is_shared_ptr<boost::ext::di::v1_3_0::_>>,boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>>,boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>>,boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>>>>>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,$_8::TEMPNAMEPLACEHOLDERVALUE()const::c,$_8::TEMPNAMEPLACEHOLDERVALUE()const::c,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,i1,impl1,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>
::operator()(injector<must_be_creatable_or_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<true,_boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,_is_shared_ptr<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
             *this)

{
  shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&> sVar1;
  injector<must_be_creatable_or_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<true,_boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,_is_shared_ptr<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_RDI;
  dependency__<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *creatable_dept;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *dependency;
  pool_t<boost::ext::di::v1_3_0::policies::constructible_impl<true,_boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,_is_shared_ptr<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  scope<i1,_impl1> *in_stack_ffffffffffffffd8;
  
  binder::operator()((injector<must_be_creatable_or_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<true,_boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,_is_shared_ptr<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
                      *)in_stack_ffffffffffffffd0);
  injector<must_be_creatable_or_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<true,_boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,_is_shared_ptr<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::cfg(in_RDI);
  anon_class_1_0_00000001::operator()::must_be_creatable_or_bound::policies(in_RDI);
  policy::operator()(in_stack_ffffffffffffffd0);
  sVar1 = scopes::deduce::scope<i1,impl1>::operator()
                    (in_stack_ffffffffffffffd8,
                     (provider<boost::ext::di::v1_3_0::aux::pair<impl1,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<must_be_creatable_or_bound,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::policies::constructible_impl<true,_boost::ext::di::v1_3_0::policies::detail::or_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>,_is_shared_ptr<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::detail::and_<boost::ext::di::v1_3_0::policies::detail::not_<boost::ext::di::v1_3_0::policies::is_root<boost::ext::di::v1_3_0::_>_>,_boost::ext::di::v1_3_0::policies::is_bound<boost::ext::di::v1_3_0::_>_>_>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,_c,_c,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
                      *)in_RDI);
  return (wrapper<std::shared_ptr<i1>,_boost::ext::di::v1_3_0::wrappers::shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>_>
          )(shared<boost::ext::di::v1_3_0::scopes::singleton,_impl1,_std::shared_ptr<impl1>_&>)
           sVar1.object;
}

Assistant:

auto create_successful_impl__() const {
    auto&& dependency = binder::resolve<T, TName>((injector*)this);
    using dependency_t = typename aux::remove_reference<decltype(dependency)>::type;
    using ctor_t = typename type_traits::ctor_traits__<binder::resolve_template_t<injector, typename dependency_t::given>, T,
                                                       typename dependency_t::ctor>::type;
    using provider_t = successful::provider<ctor_t, injector>;
    auto& creatable_dept = static_cast<dependency__<dependency_t>&>(dependency);
    using wrapper_t = decltype(creatable_dept.template create<T, TName>(provider_t{this}));
    using create_t = referable_t<T, config, dependency__<dependency_t>>;
    using ctor_args_t = typename ctor_t::second::second;
    policy::template call<arg_wrapper<T, TName, TIsRoot, ctor_args_t, dependency_t, pool_t>>(
        ((injector*)this)->cfg().policies(this));
    return successful::wrapper<create_t, wrapper_t>{creatable_dept.template create<T, TName>(provider_t{this})};
  }